

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void icetMatrixOrtho(IceTDouble left,IceTDouble right,IceTDouble bottom,IceTDouble top,
                    IceTDouble znear,IceTDouble zfar,IceTDouble *mat_out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  *mat_out = (IceTDouble)(2.0 / ((double)right - (double)left));
  mat_out[1] = 0.0;
  mat_out[2] = 0.0;
  mat_out[3] = 0.0;
  mat_out[4] = 0.0;
  mat_out[5] = (IceTDouble)(2.0 / ((double)top - (double)bottom));
  mat_out[6] = 0.0;
  mat_out[7] = 0.0;
  mat_out[8] = 0.0;
  mat_out[9] = 0.0;
  mat_out[10] = (IceTDouble)(-2.0 / ((double)zfar - (double)znear));
  mat_out[0xb] = 0.0;
  auVar1._0_8_ = -((double)left + (double)right);
  auVar1._8_8_ = -((double)bottom + (double)top);
  auVar2._8_8_ = (double)top - (double)bottom;
  auVar2._0_8_ = (double)right - (double)left;
  auVar2 = divpd(auVar1,auVar2);
  *(undefined1 (*) [16])(mat_out + 0xc) = auVar2;
  mat_out[0xe] = (IceTDouble)(-((double)znear + (double)zfar) / ((double)zfar - (double)znear));
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixOrtho(IceTDouble left, IceTDouble right,
                                 IceTDouble bottom, IceTDouble top,
                                 IceTDouble znear, IceTDouble zfar,
                                 IceTDouble *mat_out)
{
    mat_out[ 0] = 2.0/(right-left);
    mat_out[ 1] = 0.0;
    mat_out[ 2] = 0.0;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = 0.0;
    mat_out[ 5] = 2.0/(top-bottom);
    mat_out[ 6] = 0.0;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = 0.0;
    mat_out[ 9] = 0.0;
    mat_out[10] = -2.0/(zfar - znear);
    mat_out[11] = 0.0;

    mat_out[12] = -(right+left)/(right-left);
    mat_out[13] = -(top+bottom)/(top-bottom);
    mat_out[14] = -(zfar+znear)/(zfar-znear);
    mat_out[15] = 1.0;
}